

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

char * __thiscall
cppcms::impl::url_rewriter::rewrite(url_rewriter *this,char *url,string_pool *pool)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *in_RDX;
  char *in_RSI;
  vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
  *in_RDI;
  rule *r;
  size_t i;
  cmatch m;
  match_results<const_char_*> *in_stack_ffffffffffffff80;
  ulong local_48;
  int in_stack_ffffffffffffffd4;
  regex *in_stack_ffffffffffffffd8;
  cmatch *in_stack_ffffffffffffffe0;
  char *local_10;
  
  booster::match_results<const_char_*>::match_results(in_stack_ffffffffffffff80);
  local_10 = in_RSI;
  for (local_48 = 0;
      sVar2 = std::
              vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
              ::size(in_RDI), local_48 < sVar2; local_48 = local_48 + 1) {
    pvVar3 = std::
             vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
             ::operator[](in_RDI,local_48);
    bVar1 = booster::regex_match<booster::regex>
                      (in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                       in_stack_ffffffffffffffd4);
    if ((bVar1) &&
       (local_10 = rule::rewrite_once((rule *)m.end_,(cmatch *)m.begin_,(string_pool *)i),
       (pvVar3->final & 1U) != 0)) break;
  }
  booster::match_results<const_char_*>::~match_results((match_results<const_char_*> *)0x49f21e);
  return local_10;
}

Assistant:

char *rewrite(char *url,string_pool &pool) const
	{
		booster::cmatch m;
		for(size_t i=0;i<rules_.size();i++) {
			rule const &r = rules_[i];
			if(booster::regex_match(url,m,r.expression)) {
				url = r.rewrite_once(m,pool);
				if(r.final)
					break;
			}
		}
		return url;
	}